

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O3

void __thiscall
AssemblyCode::DivRegRegCommand::DivRegRegCommand
          (DivRegRegCommand *this,CTemp *leftOperand,CTemp *rightOperand)

{
  pointer pcVar1;
  
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00182cc0;
  (this->leftOperand).name._M_dataplus._M_p = (pointer)&(this->leftOperand).name.field_2;
  pcVar1 = (leftOperand->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->leftOperand,pcVar1,pcVar1 + (leftOperand->name)._M_string_length);
  (this->rightOperand).name._M_dataplus._M_p = (pointer)&(this->rightOperand).name.field_2;
  pcVar1 = (rightOperand->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rightOperand,pcVar1,pcVar1 + (rightOperand->name)._M_string_length);
  return;
}

Assistant:

AssemblyCode::DivRegRegCommand::DivRegRegCommand( const IRT::CTemp leftOperand, const IRT::CTemp rightOperand )
        : leftOperand( leftOperand ), rightOperand( rightOperand ) { }